

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetBgColor(ImGuiTableBgTarget target,ImU32 color,int column_n)

{
  float *pfVar1;
  char cVar2;
  ImGuiTable *pIVar3;
  ImU32 IVar4;
  ulong uVar5;
  ImGuiTableCellData *pIVar6;
  
  uVar5 = (ulong)(uint)column_n;
  if (target == 0) {
    __assert_fail("target != ImGuiTableBgTarget_None",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x649,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  pIVar3 = GImGui->CurrentTable;
  IVar4 = 0;
  if (color != 0x1000000) {
    IVar4 = color;
  }
  if (target - 1U < 2) {
    pfVar1 = &(pIVar3->InnerClipRect).Max.y;
    if (*pfVar1 <= pIVar3->RowPosY1 && pIVar3->RowPosY1 != *pfVar1) {
      return;
    }
    if (column_n == -1) {
      pIVar3->RowBgColor[target == 2] = IVar4;
      return;
    }
    __assert_fail("column_n == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x665,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  if (target != 3) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_tables.cpp"
                  ,0x66b,"void ImGui::TableSetBgColor(ImGuiTableBgTarget, ImU32, int)");
  }
  pfVar1 = &(pIVar3->InnerClipRect).Max.y;
  if (*pfVar1 <= pIVar3->RowPosY1 && pIVar3->RowPosY1 != *pfVar1) {
    return;
  }
  if (column_n == -1) {
    uVar5 = (ulong)(uint)pIVar3->CurrentColumn;
  }
  if ((pIVar3->VisibleMaskByIndex >> (uVar5 & 0x3f) & 1) == 0) {
    return;
  }
  cVar2 = pIVar3->RowCellDataCurrent;
  if ((long)cVar2 < 0) {
LAB_00169909:
    pIVar3->RowCellDataCurrent = cVar2 + '\x01';
  }
  else {
    pIVar6 = (pIVar3->RowCellData).Data + cVar2;
    if ((pIVar3->RowCellData).DataEnd <= pIVar6) goto LAB_00169992;
    if ((int)uVar5 != (int)pIVar6->Column) goto LAB_00169909;
  }
  if ((-1 < (long)pIVar3->RowCellDataCurrent) &&
     (pIVar6 = (pIVar3->RowCellData).Data + pIVar3->RowCellDataCurrent,
     pIVar6 < (pIVar3->RowCellData).DataEnd)) {
    pIVar6->BgColor = IVar4;
    pIVar6->Column = (ImGuiTableColumnIdx)uVar5;
    return;
  }
LAB_00169992:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_internal.h"
                ,0x24a,"T &ImSpan<ImGuiTableCellData>::operator[](int) [T = ImGuiTableCellData]");
}

Assistant:

void ImGui::TableSetBgColor(ImGuiTableBgTarget target, ImU32 color, int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(target != ImGuiTableBgTarget_None);

    if (color == IM_COL32_DISABLE)
        color = 0;

    // We cannot draw neither the cell or row background immediately as we don't know the row height at this point in time.
    switch (target)
    {
    case ImGuiTableBgTarget_CellBg:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        if (column_n == -1)
            column_n = table->CurrentColumn;
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            return;
        if (table->RowCellDataCurrent < 0 || table->RowCellData[table->RowCellDataCurrent].Column != column_n)
            table->RowCellDataCurrent++;
        ImGuiTableCellData* cell_data = &table->RowCellData[table->RowCellDataCurrent];
        cell_data->BgColor = color;
        cell_data->Column = (ImGuiTableColumnIdx)column_n;
        break;
    }
    case ImGuiTableBgTarget_RowBg0:
    case ImGuiTableBgTarget_RowBg1:
    {
        if (table->RowPosY1 > table->InnerClipRect.Max.y) // Discard
            return;
        IM_ASSERT(column_n == -1);
        int bg_idx = (target == ImGuiTableBgTarget_RowBg1) ? 1 : 0;
        table->RowBgColor[bg_idx] = color;
        break;
    }
    default:
        IM_ASSERT(0);
    }
}